

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer
          (DeviceContextVkImpl *this,SoftwareQueueIndex CmdQueue,VkCommandBuffer vkCmdBuff,
          Uint64 FenceValue)

{
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  char (*Args_1) [21];
  string msg;
  string local_48;
  
  Args_1 = (char (*) [21])FenceValue;
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[28]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkCmdBuff != VK_NULL_HANDLE",(char (*) [28])FenceValue);
    Args_1 = (char (*) [21])0xd9;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"DisposeVkCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_CmdPool == (VulkanCommandBufferPool *)0x0) {
    FormatString<char[26],char[21]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_CmdPool != nullptr",Args_1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"DisposeVkCmdBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xda);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>)
                                .super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                               m_pObject)->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,CmdQueue);
  DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::
  _SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler::
  CmdBufferRecycler(VkCommandBuffer_T*,VulkanUtilities::VulkanCommandBufferPool__
            (&local_48,vkCmdBuff,this->m_CmdPool);
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
  DiscardResource<Diligent::DeviceContextVkImpl::DisposeVkCmdBuffer(Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,VkCommandBuffer_T*,unsigned_long)::CmdBufferRecycler,void>
            (this_00,(CmdBufferRecycler *)&local_48,FenceValue);
  DisposeVkCmdBuffer::CmdBufferRecycler::~CmdBufferRecycler((CmdBufferRecycler *)&local_48);
  return;
}

Assistant:

void DeviceContextVkImpl::DisposeVkCmdBuffer(SoftwareQueueIndex CmdQueue, VkCommandBuffer vkCmdBuff, Uint64 FenceValue)
{
    VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);
    VERIFY_EXPR(m_CmdPool != nullptr);
    class CmdBufferRecycler
    {
    public:
        // clang-format off
        CmdBufferRecycler(VkCommandBuffer                           _vkCmdBuff,
                         VulkanUtilities::VulkanCommandBufferPool& _Pool) noexcept :
            vkCmdBuff {_vkCmdBuff},
            Pool      {&_Pool    }
        {
            VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);
        }

        CmdBufferRecycler             (const CmdBufferRecycler&)  = delete;
        CmdBufferRecycler& operator = (const CmdBufferRecycler&)  = delete;
        CmdBufferRecycler& operator = (      CmdBufferRecycler&&) = delete;

        CmdBufferRecycler(CmdBufferRecycler&& rhs) noexcept :
            vkCmdBuff {rhs.vkCmdBuff},
            Pool      {rhs.Pool     }
        {
            rhs.vkCmdBuff = VK_NULL_HANDLE;
            rhs.Pool      = nullptr;
        }
        // clang-format on

        ~CmdBufferRecycler()
        {
            if (Pool != nullptr)
            {
                Pool->RecycleCommandBuffer(std::move(vkCmdBuff));
            }
        }

    private:
        VkCommandBuffer                           vkCmdBuff = VK_NULL_HANDLE;
        VulkanUtilities::VulkanCommandBufferPool* Pool      = nullptr;
    };

    // Discard command buffer directly to the release queue since we know exactly which queue it was submitted to
    // as well as the associated FenceValue.
    auto& ReleaseQueue = m_pDevice->GetReleaseQueue(CmdQueue);
    ReleaseQueue.DiscardResource(CmdBufferRecycler{vkCmdBuff, *m_CmdPool}, FenceValue);
}